

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  uint *puVar1;
  Instruction *pc;
  int reg_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
    luaK_codeABCk(fs,OP_LOADTRUE,reg,0,0,0);
    break;
  case VFALSE:
    luaK_codeABCk(fs,OP_LOADFALSE,reg,0,0,0);
    break;
  case VKFLT:
    luaK_float(fs,reg,(e->u).nval);
    break;
  case VKINT:
    luaK_int(fs,reg,(e->u).ival);
    break;
  case VKSTR:
    str2K(fs,e);
  case VK:
    luaK_codek(fs,reg,(e->u).info);
    break;
  case VNONRELOC:
    if (reg != (e->u).info) {
      luaK_codeABCk(fs,OP_MOVE,reg,(e->u).info,0,0);
    }
    break;
  default:
    return;
  case VRELOC:
    puVar1 = fs->f->code + (e->u).info;
    *puVar1 = *puVar1 & 0xffff807f | (reg & 0xffU) << 7;
  }
  (e->u).info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void discharge2reg (FuncState *fs, expdesc *e, int reg) {
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VNIL: {
      luaK_nil(fs, reg, 1);
      break;
    }
    case VFALSE: {
      luaK_codeABC(fs, OP_LOADFALSE, reg, 0, 0);
      break;
    }
    case VTRUE: {
      luaK_codeABC(fs, OP_LOADTRUE, reg, 0, 0);
      break;
    }
    case VKSTR: {
      str2K(fs, e);
    }  /* FALLTHROUGH */
    case VK: {
      luaK_codek(fs, reg, e->u.info);
      break;
    }
    case VKFLT: {
      luaK_float(fs, reg, e->u.nval);
      break;
    }
    case VKINT: {
      luaK_int(fs, reg, e->u.ival);
      break;
    }
    case VRELOC: {
      Instruction *pc = &getinstruction(fs, e);
      SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
      break;
    }
    case VNONRELOC: {
      if (reg != e->u.info)
        luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
      break;
    }
    default: {
      lua_assert(e->k == VJMP);
      return;  /* nothing to do... */
    }
  }
  e->u.info = reg;
  e->k = VNONRELOC;
}